

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void int_tcfg_get(char *key,TRUN_ConfigItem *outValue)

{
  bool bVar1;
  uint uVar2;
  Config *pCVar3;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (outValue != (TRUN_ConfigItem *)0x0 && key != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"continue_on_assert",&local_41);
    bVar1 = std::operator==(&local_40,key);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      outValue->isValid = true;
      strncpy(outValue->name,key,0x1f);
      outValue->value_type = kTRCfgType_Bool;
      pCVar3 = trun::Config::Instance();
      uVar2 = (uint)pCVar3->continueOnAssert;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"enableThreadTestExecution",&local_41);
      bVar1 = std::operator==(&local_40,key);
      std::__cxx11::string::~string((string *)&local_40);
      if (!bVar1) {
        return;
      }
      outValue->isValid = true;
      builtin_strncpy(outValue->name,"enableThreadTestExecution",0x1a);
      outValue->name[0x1a] = '\0';
      outValue->name[0x1b] = '\0';
      outValue->name[0x1c] = '\0';
      outValue->name[0x1d] = '\0';
      outValue->name[0x1e] = '\0';
      outValue->value_type = kTRCfgType_Bool;
      uVar2 = 1;
    }
    *(uint *)&outValue->value = uVar2;
  }
  return;
}

Assistant:

static void int_tcfg_get(const char *key, TRUN_ConfigItem *outValue) {
    if (key == nullptr) {
        return;
    }
    if (outValue == nullptr) {
        return;
    }
    // test test
    if (key == std::string("continue_on_assert")) {
        outValue->isValid = true;
        strncpy(outValue->name, key, TR_CFG_ITEM_NAME_LEN-1);
        outValue->value_type = kTRCfgType_Bool;
        outValue->value.boolean = Config::Instance().continueOnAssert;
        return;
    }


    // TODO: Implement properly...
    if (key != std::string("enableThreadTestExecution")) {
        return;
    }
    outValue->isValid = true;
    strncpy(outValue->name,  "enableThreadTestExecution", TR_CFG_ITEM_NAME_LEN-1);
    outValue->value_type = kTRCfgType_Bool;
//    outValue->value.boolean = Config::Instance().enableThreadTestExecution;
    outValue->value.boolean = true;
}